

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopInsert(WhereLoopBuilder *pBuilder,WhereLoop *pTemplate)

{
  u8 uVar1;
  sqlite3 *db;
  WhereLoop *p;
  Index *pIVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  undefined8 uVar5;
  u32 uVar6;
  u16 uVar7;
  u16 uVar8;
  u8 uVar9;
  LogEst LVar10;
  LogEst LVar11;
  LogEst LVar12;
  int iVar13;
  WhereLoop **ppWVar14;
  WhereLoop *pWVar15;
  short sVar16;
  WhereLoop *in_RDX;
  
  if (pTemplate == (WhereLoop *)0x0) {
    db = (sqlite3 *)pBuilder->pWInfo->pParse;
    pWVar15 = (WhereLoop *)pBuilder[1].pOrSet;
    if ((pWVar15 != (WhereLoop *)0x0) && ((in_RDX->wsFlags & 0x200) != 0)) {
      uVar1 = in_RDX->iTab;
      do {
        if ((pWVar15->iTab == uVar1) && ((pWVar15->wsFlags & 0x200) != 0)) {
          iVar13 = whereLoopCheaperProperSubset(pWVar15,in_RDX);
          sVar16 = -1;
          if (iVar13 == 0) {
            iVar13 = whereLoopCheaperProperSubset(in_RDX,pWVar15);
            sVar16 = 1;
            if (iVar13 == 0) goto LAB_002484ec;
          }
          in_RDX->rRun = pWVar15->rRun;
          in_RDX->nOut = sVar16 + pWVar15->nOut;
        }
LAB_002484ec:
        pWVar15 = pWVar15->pNextLoop;
      } while (pWVar15 != (WhereLoop *)0x0);
    }
    ppWVar14 = whereLoopFindLesser((WhereLoop **)&pBuilder[1].pOrSet,in_RDX);
    if (ppWVar14 == (WhereLoop **)0x0) {
      iVar13 = 0;
    }
    else {
      pWVar15 = *ppWVar14;
      if (pWVar15 == (WhereLoop *)0x0) {
        pWVar15 = (WhereLoop *)sqlite3DbMallocRawNN(db,0x60);
        *ppWVar14 = pWVar15;
        if (pWVar15 == (WhereLoop *)0x0) {
          return 7;
        }
        pWVar15->aLTerm = pWVar15->aLTermSpace;
        pWVar15->nLTerm = 0;
        pWVar15->nLSlot = 3;
        pWVar15->wsFlags = 0;
        pWVar15->pNextLoop = (WhereLoop *)0x0;
      }
      else if (pWVar15->pNextLoop != (WhereLoop *)0x0) {
        ppWVar14 = &pWVar15->pNextLoop;
        do {
          ppWVar14 = whereLoopFindLesser(ppWVar14,in_RDX);
          if ((ppWVar14 == (WhereLoop **)0x0) || (p = *ppWVar14, p == (WhereLoop *)0x0)) break;
          *ppWVar14 = p->pNextLoop;
          whereLoopClear(db,p);
          sqlite3DbFreeNN(db,p);
        } while (*ppWVar14 != (WhereLoop *)0x0);
      }
      whereLoopClearUnion(db,pWVar15);
      iVar13 = whereLoopResize(db,pWVar15,(uint)in_RDX->nLTerm);
      if (iVar13 == 0) {
        BVar3 = in_RDX->prereq;
        BVar4 = in_RDX->maskSelf;
        uVar1 = in_RDX->iTab;
        uVar9 = in_RDX->iSortIdx;
        LVar10 = in_RDX->rSetup;
        LVar11 = in_RDX->rRun;
        LVar12 = in_RDX->nOut;
        uVar5 = *(undefined8 *)&in_RDX->u;
        uVar6 = in_RDX->wsFlags;
        uVar7 = in_RDX->nLTerm;
        uVar8 = in_RDX->nSkip;
        (pWVar15->u).btree.pIndex = (in_RDX->u).btree.pIndex;
        pWVar15->wsFlags = uVar6;
        pWVar15->nLTerm = uVar7;
        pWVar15->nSkip = uVar8;
        pWVar15->iTab = uVar1;
        pWVar15->iSortIdx = uVar9;
        pWVar15->rSetup = LVar10;
        pWVar15->rRun = LVar11;
        pWVar15->nOut = LVar12;
        *(undefined8 *)&pWVar15->u = uVar5;
        pWVar15->prereq = BVar3;
        pWVar15->maskSelf = BVar4;
        memcpy(pWVar15->aLTerm,in_RDX->aLTerm,(ulong)pWVar15->nLTerm << 3);
        if ((in_RDX->wsFlags >> 10 & 1) == 0) {
          iVar13 = 0;
          if ((in_RDX->wsFlags >> 0xe & 1) != 0) {
            (in_RDX->u).btree.pIndex = (Index *)0x0;
            iVar13 = 0;
          }
        }
        else {
          (in_RDX->u).vtab.needFree = '\0';
          iVar13 = 0;
        }
      }
      else {
        *(undefined8 *)&pWVar15->u = 0;
        (pWVar15->u).btree.pIndex = (Index *)0x0;
        iVar13 = 7;
      }
      if ((((pWVar15->wsFlags & 0x400) == 0) &&
          (pIVar2 = (pWVar15->u).btree.pIndex, pIVar2 != (Index *)0x0)) && (pIVar2->tnum == 0)) {
        (pWVar15->u).btree.pIndex = (Index *)0x0;
      }
    }
  }
  else {
    iVar13 = 0;
    if (in_RDX->nLTerm != 0) {
      whereOrInsert((WhereOrSet *)pTemplate,in_RDX->prereq,in_RDX->rRun,in_RDX->nOut);
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

static int whereLoopInsert(WhereLoopBuilder *pBuilder, WhereLoop *pTemplate){
  WhereLoop **ppPrev, *p;
  WhereInfo *pWInfo = pBuilder->pWInfo;
  sqlite3 *db = pWInfo->pParse->db;
  int rc;

  /* If pBuilder->pOrSet is defined, then only keep track of the costs
  ** and prereqs.
  */
  if( pBuilder->pOrSet!=0 ){
    if( pTemplate->nLTerm ){
#if WHERETRACE_ENABLED
      u16 n = pBuilder->pOrSet->n;
      int x =
#endif
      whereOrInsert(pBuilder->pOrSet, pTemplate->prereq, pTemplate->rRun,
                                    pTemplate->nOut);
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(x?"   or-%d:  ":"   or-X:  ", n);
        whereLoopPrint(pTemplate, pBuilder->pWC);
      }
#endif
    }
    return SQLITE_OK;
  }

  /* Look for an existing WhereLoop to replace with pTemplate
  */
  whereLoopAdjustCost(pWInfo->pLoops, pTemplate);
  ppPrev = whereLoopFindLesser(&pWInfo->pLoops, pTemplate);

  if( ppPrev==0 ){
    /* There already exists a WhereLoop on the list that is better
    ** than pTemplate, so just ignore pTemplate */
#if WHERETRACE_ENABLED /* 0x8 */
    if( sqlite3WhereTrace & 0x8 ){
      sqlite3DebugPrintf("   skip: ");
      whereLoopPrint(pTemplate, pBuilder->pWC);
    }
#endif
    return SQLITE_OK;  
  }else{
    p = *ppPrev;
  }

  /* If we reach this point it means that either p[] should be overwritten
  ** with pTemplate[] if p[] exists, or if p==NULL then allocate a new
  ** WhereLoop and insert it.
  */
#if WHERETRACE_ENABLED /* 0x8 */
  if( sqlite3WhereTrace & 0x8 ){
    if( p!=0 ){
      sqlite3DebugPrintf("replace: ");
      whereLoopPrint(p, pBuilder->pWC);
      sqlite3DebugPrintf("   with: ");
    }else{
      sqlite3DebugPrintf("    add: ");
    }
    whereLoopPrint(pTemplate, pBuilder->pWC);
  }
#endif
  if( p==0 ){
    /* Allocate a new WhereLoop to add to the end of the list */
    *ppPrev = p = sqlite3DbMallocRawNN(db, sizeof(WhereLoop));
    if( p==0 ) return SQLITE_NOMEM_BKPT;
    whereLoopInit(p);
    p->pNextLoop = 0;
  }else{
    /* We will be overwriting WhereLoop p[].  But before we do, first
    ** go through the rest of the list and delete any other entries besides
    ** p[] that are also supplated by pTemplate */
    WhereLoop **ppTail = &p->pNextLoop;
    WhereLoop *pToDel;
    while( *ppTail ){
      ppTail = whereLoopFindLesser(ppTail, pTemplate);
      if( ppTail==0 ) break;
      pToDel = *ppTail;
      if( pToDel==0 ) break;
      *ppTail = pToDel->pNextLoop;
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(" delete: ");
        whereLoopPrint(pToDel, pBuilder->pWC);
      }
#endif
      whereLoopDelete(db, pToDel);
    }
  }
  rc = whereLoopXfer(db, p, pTemplate);
  if( (p->wsFlags & WHERE_VIRTUALTABLE)==0 ){
    Index *pIndex = p->u.btree.pIndex;
    if( pIndex && pIndex->tnum==0 ){
      p->u.btree.pIndex = 0;
    }
  }
  return rc;
}